

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cpp
# Opt level: O1

void __thiscall index_tree::create_index_tree(index_tree *this)

{
  bool bVar1;
  shared_ptr<index> idx;
  undefined1 local_4d;
  int local_4c;
  shared_ptr<index> local_48;
  index_tree *local_38;
  
  local_4c = 1;
  do {
    local_48.super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_38 = this;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<index,std::allocator<index>,int&,index_tree*>
              (&local_48.super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (index **)&local_48,(allocator<index> *)&local_4d,&local_4c,&local_38);
    std::vector<std::shared_ptr<index>,std::allocator<std::shared_ptr<index>>>::
    emplace_back<std::shared_ptr<index>&>
              ((vector<std::shared_ptr<index>,std::allocator<std::shared_ptr<index>>> *)this,
               &local_48);
    if (local_48.super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<index,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    bVar1 = local_4c < 0x14;
    local_4c = local_4c + 1;
  } while (bVar1);
  return;
}

Assistant:

void index_tree::create_index_tree()
{
	for (int i = 1; i <= max_index_level; ++i)
	{
		auto idx = std::make_shared<index>(i, this);
		indexes_.emplace_back(idx);
	}
}